

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O3

long yytnamerr(char *yyres,char *yystr)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  
  if (*yystr != '\"') {
LAB_00125892:
    if (yyres != (char *)0x0) {
      pcVar3 = stpcpy(yyres,yystr);
      return (long)pcVar3 - (long)yyres;
    }
    sVar4 = strlen(yystr);
    return sVar4;
  }
  lVar2 = 0;
  pcVar3 = yystr;
  do {
    pcVar5 = pcVar3 + 1;
    bVar1 = pcVar3[1];
    if (bVar1 < 0x5c) {
      if (bVar1 == 0x22) {
        if (yyres == (char *)0x0) {
          return lVar2;
        }
        yyres[lVar2] = '\0';
        return lVar2;
      }
      if ((bVar1 == 0x27) || (bVar1 == 0x2c)) goto LAB_00125892;
    }
    else if (bVar1 == 0x5c) {
      if (pcVar3[2] != '\\') goto LAB_00125892;
      pcVar5 = pcVar3 + 2;
    }
    if (yyres != (char *)0x0) {
      yyres[lVar2] = bVar1;
    }
    lVar2 = lVar2 + 1;
    pcVar3 = pcVar5;
  } while( true );
}

Assistant:

static YYPTRDIFF_T
yytnamerr (char *yyres, const char *yystr)
{
  if (*yystr == '"')
    {
      YYPTRDIFF_T yyn = 0;
      char const *yyp = yystr;
      for (;;)
        switch (*++yyp)
          {
          case '\'':
          case ',':
            goto do_not_strip_quotes;

          case '\\':
            if (*++yyp != '\\')
              goto do_not_strip_quotes;
            else
              goto append;

          append:
          default:
            if (yyres)
              yyres[yyn] = *yyp;
            yyn++;
            break;

          case '"':
            if (yyres)
              yyres[yyn] = '\0';
            return yyn;
          }
    do_not_strip_quotes: ;
    }

  if (yyres)
    return yystpcpy (yyres, yystr) - yyres;
  else
    return yystrlen (yystr);
}